

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprkstep_io.c
# Opt level: O1

int sprkStep_PrintAllStats(ARKodeMem ark_mem,FILE *outfile,SUNOutputFormat fmt)

{
  long lVar1;
  int iVar2;
  ARKodeSPRKStepMem step_mem;
  ARKodeSPRKStepMem local_28;
  
  local_28 = (ARKodeSPRKStepMem)0x0;
  iVar2 = sprkStep_AccessStepMem(ark_mem,"sprkStep_PrintAllStats",&local_28);
  if (iVar2 == 0) {
    lVar1 = local_28->nf1;
    if (fmt == SUN_OUTPUTFORMAT_TABLE) {
      fprintf((FILE *)outfile,"%-*s = %ld\n",0x1d,"f1 RHS fn evals",lVar1);
    }
    else {
      fputc(0x2c,(FILE *)outfile);
      fprintf((FILE *)outfile,"%s,%ld","f1 RHS fn evals",lVar1);
    }
    lVar1 = local_28->nf2;
    if (fmt == SUN_OUTPUTFORMAT_TABLE) {
      iVar2 = 0;
      fprintf((FILE *)outfile,"%-*s = %ld\n",0x1d,"f2 RHS fn evals",lVar1);
    }
    else {
      fputc(0x2c,(FILE *)outfile);
      iVar2 = 0;
      fprintf((FILE *)outfile,"%s,%ld","f2 RHS fn evals",lVar1);
    }
  }
  return iVar2;
}

Assistant:

int sprkStep_PrintAllStats(ARKodeMem ark_mem, FILE* outfile, SUNOutputFormat fmt)
{
  ARKodeSPRKStepMem step_mem = NULL;
  int retval                 = 0;

  /* access ARKodeSPRKStepMem structure */
  retval = sprkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  sunfprintf_long(outfile, fmt, SUNFALSE, "f1 RHS fn evals", step_mem->nf1);
  sunfprintf_long(outfile, fmt, SUNFALSE, "f2 RHS fn evals", step_mem->nf2);

  return (ARK_SUCCESS);
}